

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSGetFilteredUnicodeSetForUnicode_63
               (UConverterSharedData *sharedData,USetAdder *sa,UConverterUnicodeSet which,
               UConverterSetFilter filter,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  byte local_8a;
  uint8_t b;
  uint uStack_84;
  UBool useFallback;
  uint32_t value;
  uint32_t st3Multiplier;
  uint8_t *bytes;
  uint8_t *stage3_1;
  uint32_t *stage2_1;
  uint16_t minValue;
  uint16_t *results;
  uint16_t *stage3;
  uint16_t *stage2;
  UChar32 c;
  uint uStack_3c;
  uint16_t st2;
  uint16_t maxStage1;
  uint16_t st1;
  uint32_t st3;
  uint16_t *table;
  UConverterMBCSTable *mbcsTable;
  UErrorCode *pErrorCode_local;
  UConverterSetFilter filter_local;
  UConverterUnicodeSet which_local;
  USetAdder *sa_local;
  UConverterSharedData *sharedData_local;
  
  puVar3 = (sharedData->mbcs).fromUnicodeTable;
  if (((sharedData->mbcs).unicodeMask & 1) == 0) {
    c._0_2_ = 0x40;
  }
  else {
    c._0_2_ = 0x440;
  }
  stage2._0_4_ = 0;
  if ((sharedData->mbcs).outputType == '\0') {
    puVar4 = (sharedData->mbcs).fromUnicodeBytes;
    if (which == UCNV_ROUNDTRIP_SET) {
      stage2_1._6_2_ = 0xf00;
    }
    else {
      stage2_1._6_2_ = 0x800;
    }
    for (c._2_2_ = 0; c._2_2_ < (ushort)c; c._2_2_ = c._2_2_ + 1) {
      uVar2 = puVar3[c._2_2_];
      if ((ushort)c < uVar2) {
        for (stage2._6_2_ = 0; stage2._6_2_ < 0x40; stage2._6_2_ = stage2._6_2_ + 1) {
          if (puVar3[(long)(int)(uint)uVar2 + (ulong)stage2._6_2_] == 0) {
            stage2._0_4_ = (uint)stage2 + 0x10;
          }
          else {
            results = (uint16_t *)
                      (puVar4 + (ulong)(uint)puVar3[(long)(int)(uint)uVar2 + (ulong)stage2._6_2_] *
                                2);
            do {
              if (stage2_1._6_2_ <= *results) {
                (*(code *)sa->add)(sa->set,(uint)stage2);
              }
              stage2._0_4_ = (uint)stage2 + 1;
              results = results + 1;
            } while (((uint)stage2 & 0xf) != 0);
          }
        }
      }
      else {
        stage2._0_4_ = (uint)stage2 + 0x400;
      }
    }
    goto LAB_00395b3f;
  }
  puVar4 = (sharedData->mbcs).fromUnicodeBytes;
  bVar5 = which == UCNV_ROUNDTRIP_AND_FALLBACK_SET;
  uVar1 = (sharedData->mbcs).outputType;
  if (uVar1 == '\x02') {
LAB_003956b9:
    uStack_84 = 3;
  }
  else if (uVar1 == '\x03') {
    uStack_84 = 4;
  }
  else {
    if (uVar1 == '\t') goto LAB_003956b9;
    uStack_84 = 2;
  }
  for (c._2_2_ = 0; c._2_2_ < (ushort)c; c._2_2_ = c._2_2_ + 1) {
    uVar2 = puVar3[c._2_2_];
    if ((uint)((int)(uint)(ushort)c >> 1) < (uint)uVar2) {
      for (stage2._6_2_ = 0; stage2._6_2_ < 0x40; stage2._6_2_ = stage2._6_2_ + 1) {
        uStack_3c = *(uint *)(puVar3 + (long)(int)(uint)uVar2 * 2 + (ulong)stage2._6_2_ * 2);
        if (uStack_3c == 0) {
          stage2._0_4_ = (uint)stage2 + 0x10;
        }
        else {
          bytes = puVar4 + uStack_84 * (uStack_3c & 0xffff) * 0x10;
          uStack_3c = uStack_3c >> 0x10;
          switch(filter) {
          case UCNV_SET_FILTER_NONE:
            do {
              if ((uStack_3c & 1) == 0) {
                if (bVar5) {
                  local_8a = 0;
                  if (uStack_84 == 2) {
LAB_0039584a:
                    local_8a = local_8a | *bytes | bytes[1];
                    bytes = bytes + 2;
                  }
                  else {
                    if (uStack_84 == 3) {
LAB_00395829:
                      local_8a = local_8a | *bytes;
                      bytes = bytes + 1;
                      goto LAB_0039584a;
                    }
                    if (uStack_84 == 4) {
                      local_8a = *bytes;
                      bytes = bytes + 1;
                      goto LAB_00395829;
                    }
                  }
                  if (local_8a != 0) {
                    (*(code *)sa->add)(sa->set,(uint)stage2);
                  }
                }
              }
              else {
                (*(code *)sa->add)(sa->set,(uint)stage2);
                bytes = bytes + uStack_84;
              }
              uStack_3c = uStack_3c >> 1;
              stage2._0_4_ = (uint)stage2 + 1;
            } while (((uint)stage2 & 0xf) != 0);
            break;
          case UCNV_SET_FILTER_DBCS_ONLY:
            do {
              if ((((uStack_3c & 1) != 0) || (bVar5)) && (0xff < *(ushort *)bytes)) {
                (*(code *)sa->add)(sa->set,(uint)stage2);
              }
              uStack_3c = uStack_3c >> 1;
              bytes = bytes + 2;
              stage2._0_4_ = (uint)stage2 + 1;
            } while (((uint)stage2 & 0xf) != 0);
            break;
          case UCNV_SET_FILTER_2022_CN:
            do {
              if ((((uStack_3c & 1) != 0) || (bVar5)) && ((*bytes == 0x81 || (*bytes == 0x82)))) {
                (*(code *)sa->add)(sa->set,(uint)stage2);
              }
              uStack_3c = uStack_3c >> 1;
              bytes = bytes + 3;
              stage2._0_4_ = (uint)stage2 + 1;
            } while (((uint)stage2 & 0xf) != 0);
            break;
          case UCNV_SET_FILTER_SJIS:
            do {
              if ((((uStack_3c & 1) != 0) || (bVar5)) &&
                 ((0x813f < *(ushort *)bytes && (*(ushort *)bytes < 0xeffd)))) {
                (*(code *)sa->add)(sa->set,(uint)stage2);
              }
              uStack_3c = uStack_3c >> 1;
              bytes = bytes + 2;
              stage2._0_4_ = (uint)stage2 + 1;
            } while (((uint)stage2 & 0xf) != 0);
            break;
          case UCNV_SET_FILTER_GR94DBCS:
            do {
              if ((((uStack_3c & 1) != 0) || (bVar5)) &&
                 (((ushort)(*(short *)bytes + 0x5e5fU) < 0x5d5e &&
                  ((*(short *)bytes - 0xa1U & 0xff) < 0x5e)))) {
                (*(code *)sa->add)(sa->set,(uint)stage2);
              }
              uStack_3c = uStack_3c >> 1;
              bytes = bytes + 2;
              stage2._0_4_ = (uint)stage2 + 1;
            } while (((uint)stage2 & 0xf) != 0);
            break;
          case UCNV_SET_FILTER_HZ:
            do {
              if (((((uStack_3c & 1) != 0) || (bVar5)) &&
                  ((ushort)(*(short *)bytes + 0x5e5fU) < 0x5c5e)) &&
                 ((*(short *)bytes - 0xa1U & 0xff) < 0x5e)) {
                (*(code *)sa->add)(sa->set,(uint)stage2);
              }
              uStack_3c = uStack_3c >> 1;
              bytes = bytes + 2;
              stage2._0_4_ = (uint)stage2 + 1;
            } while (((uint)stage2 & 0xf) != 0);
            break;
          default:
            *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
            return;
          }
        }
      }
    }
    else {
      stage2._0_4_ = (uint)stage2 + 0x400;
    }
  }
LAB_00395b3f:
  ucnv_extGetUnicodeSet_63(sharedData,sa,which,filter,pErrorCode);
  return;
}

Assistant:

U_CFUNC void 
ucnv_MBCSGetFilteredUnicodeSetForUnicode(const UConverterSharedData *sharedData,
                                         const USetAdder *sa,
                                         UConverterUnicodeSet which,
                                         UConverterSetFilter filter,
                                         UErrorCode *pErrorCode) {
    const UConverterMBCSTable *mbcsTable;
    const uint16_t *table;

    uint32_t st3;
    uint16_t st1, maxStage1, st2;

    UChar32 c;

    /* enumerate the from-Unicode trie table */
    mbcsTable=&sharedData->mbcs;
    table=mbcsTable->fromUnicodeTable;
    if(mbcsTable->unicodeMask&UCNV_HAS_SUPPLEMENTARY) {
        maxStage1=0x440;
    } else {
        maxStage1=0x40;
    }

    c=0; /* keep track of the current code point while enumerating */

    if(mbcsTable->outputType==MBCS_OUTPUT_1) {
        const uint16_t *stage2, *stage3, *results;
        uint16_t minValue;

        results=(const uint16_t *)mbcsTable->fromUnicodeBytes;

        /*
         * Set a threshold variable for selecting which mappings to use.
         * See ucnv_MBCSSingleFromBMPWithOffsets() and
         * MBCS_SINGLE_RESULT_FROM_U() for details.
         */
        if(which==UCNV_ROUNDTRIP_SET) {
            /* use only roundtrips */
            minValue=0xf00;
        } else /* UCNV_ROUNDTRIP_AND_FALLBACK_SET */ {
            /* use all roundtrip and fallback results */
            minValue=0x800;
        }

        for(st1=0; st1<maxStage1; ++st1) {
            st2=table[st1];
            if(st2>maxStage1) {
                stage2=table+st2;
                for(st2=0; st2<64; ++st2) {
                    if((st3=stage2[st2])!=0) {
                        /* read the stage 3 block */
                        stage3=results+st3;

                        do {
                            if(*stage3++>=minValue) {
                                sa->add(sa->set, c);
                            }
                        } while((++c&0xf)!=0);
                    } else {
                        c+=16; /* empty stage 3 block */
                    }
                }
            } else {
                c+=1024; /* empty stage 2 block */
            }
        }
    } else {
        const uint32_t *stage2;
        const uint8_t *stage3, *bytes;
        uint32_t st3Multiplier;
        uint32_t value;
        UBool useFallback;

        bytes=mbcsTable->fromUnicodeBytes;

        useFallback=(UBool)(which==UCNV_ROUNDTRIP_AND_FALLBACK_SET);

        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4_EUC:
            st3Multiplier=3;
            break;
        case MBCS_OUTPUT_4:
            st3Multiplier=4;
            break;
        default:
            st3Multiplier=2;
            break;
        }

        for(st1=0; st1<maxStage1; ++st1) {
            st2=table[st1];
            if(st2>(maxStage1>>1)) {
                stage2=(const uint32_t *)table+st2;
                for(st2=0; st2<64; ++st2) {
                    if((st3=stage2[st2])!=0) {
                        /* read the stage 3 block */
                        stage3=bytes+st3Multiplier*16*(uint32_t)(uint16_t)st3;

                        /* get the roundtrip flags for the stage 3 block */
                        st3>>=16;

                        /*
                         * Add code points for which the roundtrip flag is set,
                         * or which map to non-zero bytes if we use fallbacks.
                         * See ucnv_MBCSFromUnicodeWithOffsets() for details.
                         */
                        switch(filter) {
                        case UCNV_SET_FILTER_NONE:
                            do {
                                if(st3&1) {
                                    sa->add(sa->set, c);
                                    stage3+=st3Multiplier;
                                } else if(useFallback) {
                                    uint8_t b=0;
                                    switch(st3Multiplier) {
                                    case 4:
                                        b|=*stage3++;
                                        U_FALLTHROUGH;
                                    case 3:
                                        b|=*stage3++;
                                        U_FALLTHROUGH;
                                    case 2:
                                        b|=stage3[0]|stage3[1];
                                        stage3+=2;
                                        U_FALLTHROUGH;
                                    default:
                                        break;
                                    }
                                    if(b!=0) {
                                        sa->add(sa->set, c);
                                    }
                                }
                                st3>>=1;
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_DBCS_ONLY:
                             /* Ignore single-byte results (<0x100). */
                            do {
                                if(((st3&1)!=0 || useFallback) && *((const uint16_t *)stage3)>=0x100) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_2022_CN:
                             /* Only add code points that map to CNS 11643 planes 1 & 2 for non-EXT ISO-2022-CN. */
                            do {
                                if(((st3&1)!=0 || useFallback) && ((value=*stage3)==0x81 || value==0x82)) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=3;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_SJIS:
                             /* Only add code points that map to Shift-JIS codes corresponding to JIS X 0208. */
                            do {
                                if(((st3&1)!=0 || useFallback) && (value=*((const uint16_t *)stage3))>=0x8140 && value<=0xeffc) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_GR94DBCS:
                            /* Only add code points that map to ISO 2022 GR 94 DBCS codes (each byte A1..FE). */
                            do {
                                if( ((st3&1)!=0 || useFallback) &&
                                    (uint16_t)((value=*((const uint16_t *)stage3)) - 0xa1a1)<=(0xfefe - 0xa1a1) &&
                                    (uint8_t)(value-0xa1)<=(0xfe - 0xa1)
                                ) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        case UCNV_SET_FILTER_HZ:
                            /* Only add code points that are suitable for HZ DBCS (lead byte A1..FD). */
                            do {
                                if( ((st3&1)!=0 || useFallback) &&
                                    (uint16_t)((value=*((const uint16_t *)stage3))-0xa1a1)<=(0xfdfe - 0xa1a1) &&
                                    (uint8_t)(value-0xa1)<=(0xfe - 0xa1)
                                ) {
                                    sa->add(sa->set, c);
                                }
                                st3>>=1;
                                stage3+=2;  /* +=st3Multiplier */
                            } while((++c&0xf)!=0);
                            break;
                        default:
                            *pErrorCode=U_INTERNAL_PROGRAM_ERROR;
                            return;
                        }
                    } else {
                        c+=16; /* empty stage 3 block */
                    }
                }
            } else {
                c+=1024; /* empty stage 2 block */
            }
        }
    }

    ucnv_extGetUnicodeSet(sharedData, sa, which, filter, pErrorCode);
}